

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool testing::internal::DeathTest::Create
               (char *statement,
               Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *matcher,char *file,int line,DeathTest **test)

{
  int iVar1;
  DeathTestFactory *pDVar2;
  uint in_ECX;
  undefined8 in_RDX;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffff88;
  undefined1 local_40 [24];
  undefined8 local_28;
  uint local_1c;
  undefined8 local_18;
  undefined8 local_8;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  GetUnitTestImpl();
  pDVar2 = UnitTestImpl::death_test_factory((UnitTestImpl *)0x1f0c2e);
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher(in_RSI,in_stack_ffffffffffffff88);
  iVar1 = (*pDVar2->_vptr_DeathTestFactory[2])
                    (pDVar2,local_8,local_40,local_18,(ulong)local_1c,local_28);
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            *)0x1f0c88);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool DeathTest::Create(const char* statement,
                       Matcher<const std::string&> matcher, const char* file,
                       int line, DeathTest** test) {
  return GetUnitTestImpl()->death_test_factory()->Create(
      statement, std::move(matcher), file, line, test);
}